

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O2

UniquePtr<SSL_SESSION> __thiscall
bssl::SSL_SESSION_parse(bssl *this,CBS *cbs,SSL_X509_METHOD *x509_method,CRYPTO_BUFFER_POOL *pool)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  UniquePtr<SSL_SESSION> UVar3;
  bool bVar4;
  enable_if_t<_internal::StackTraits<stack_st_CRYPTO_BUFFER>::kIsConst,_bool> eVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  SSL_CIPHER *pSVar10;
  OPENSSL_STACK *__p;
  tuple<crypto_buffer_st_*,_bssl::internal::Deleter> tVar11;
  byte bVar12;
  byte bVar13;
  undefined8 uVar14;
  ulong uVar15;
  uint8_t *__p_00;
  CBS *pCVar16;
  __uniq_ptr_impl<char,_bssl::internal::Deleter> *this_00;
  SSL_X509_METHOD *in_stack_fffffffffffffea8;
  UniquePtr<SSL_SESSION> ret;
  CBS session;
  int has_peer;
  uint16_t cipher_value;
  CBS age_add;
  int age_add_present;
  CBS settings;
  CBS original_handshake_hash;
  int is_resumable_across_names;
  int has_peer_alps;
  int has_local_alps;
  int is_quic;
  int is_server;
  int has_cert_chain;
  int extended_master_secret;
  uint16_t unused;
  CBS child;
  CBS local_c8;
  UniquePtr<typename_internal::StackTraits<stack_st_CRYPTO_BUFFER>::Type> local_b8;
  UniquePtr<typename_internal::StackTraits<stack_st_CRYPTO_BUFFER>::Type> local_b0;
  uint64_t ssl_version;
  uint64_t timeout;
  uint64_t version;
  CBS sid_ctx;
  CBS peer;
  CBS secret;
  CBS session_id;
  CBS cipher;
  CBS unused_hostname;
  
  ssl_session_new(in_stack_fffffffffffffea8);
  if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
      ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
    iVar8 = CBS_get_asn1(cbs,&session,0x20000010);
    if ((((iVar8 == 0) || (iVar8 = CBS_get_asn1_uint64(&session,&version), iVar8 == 0)) ||
        (version != 1)) ||
       ((iVar8 = CBS_get_asn1_uint64(&session,&ssl_version),
        0xffff < CONCAT62(ssl_version._2_6_,(uint16_t)ssl_version) || iVar8 == 0 ||
        (bVar4 = ssl_protocol_version_from_wire(&unused,(uint16_t)ssl_version), !bVar4)))) {
      ERR_put_error(0x10,0,0xa0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                    ,0x1e1);
    }
    else {
      *(uint16_t *)
       ((long)ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 4) =
           (uint16_t)ssl_version;
      iVar8 = CBS_get_asn1(&session,&cipher,4);
      if (((iVar8 == 0) || (iVar8 = CBS_get_u16(&cipher,&cipher_value), iVar8 == 0)) ||
         (cipher.len != 0)) {
        ERR_put_error(0x10,0,0xa0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                      ,0x1eb);
      }
      else {
        pSVar10 = SSL_get_cipher_by_value(cipher_value);
        *(SSL_CIPHER **)
         ((long)ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0xd8) = pSVar10;
        if (pSVar10 == (SSL_CIPHER *)0x0) {
          ERR_put_error(0x10,0,0xed,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                        ,0x1f0);
        }
        else {
          iVar8 = CBS_get_asn1(&session,&session_id,4);
          if ((((((iVar8 == 0) ||
                 (bVar4 = InplaceVector<unsigned_char,_32UL>::TryCopyFrom
                                    ((InplaceVector<unsigned_char,_32UL> *)
                                     ((long)ret._M_t.
                                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                            _M_head_impl + 0x4b),
                                     (Span<const_unsigned_char>)session_id), !bVar4)) ||
                (iVar8 = CBS_get_asn1(&session,&secret,4), iVar8 == 0)) ||
               ((bVar4 = InplaceVector<unsigned_char,_64UL>::TryCopyFrom
                                   ((InplaceVector<unsigned_char,_64UL> *)
                                    ((long)ret._M_t.
                                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                           _M_head_impl + 10),(Span<const_unsigned_char>)secret),
                !bVar4 || (iVar8 = CBS_get_asn1(&session,&child,0xa0000001), iVar8 == 0)))) ||
              (iVar8 = CBS_get_asn1_uint64(&child,(uint64_t *)
                                                  ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0xd0)), iVar8 == 0)) ||
             ((iVar8 = CBS_get_asn1(&session,&child,0xa0000002), iVar8 == 0 ||
              (iVar8 = CBS_get_asn1_uint64(&child,&timeout), timeout >> 0x20 != 0 || iVar8 == 0))))
          {
            ERR_put_error(0x10,0,0xa0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                          ,0x1ff);
          }
          else {
            *(int *)((long)ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 200) =
                 (int)timeout;
            iVar8 = CBS_get_optional_asn1(&session,&peer,&has_peer,0xa0000003);
            if ((iVar8 == 0) || ((has_peer != 0 && (peer.len == 0)))) {
              ERR_put_error(0x10,0,0xa0,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                            ,0x209);
            }
            else {
              iVar8 = CBS_get_optional_asn1_octet_string(&session,&sid_ctx,(int *)0x0,0xa0000004);
              if ((iVar8 != 0) &&
                 (bVar4 = InplaceVector<unsigned_char,_32UL>::TryCopyFrom
                                    ((InplaceVector<unsigned_char,_32UL> *)
                                     ((long)ret._M_t.
                                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                            _M_head_impl + 0x6c),(Span<const_unsigned_char>)sid_ctx)
                 , UVar3 = ret, bVar4)) {
                iVar8 = CBS_get_optional_asn1_uint64
                                  (&session,(uint64_t *)&original_handshake_hash,0xa0000005,0);
                if ((long)original_handshake_hash.data < 0 || iVar8 == 0) {
                  ERR_put_error(0x10,0,0xa0,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                ,0x1ab);
                }
                else {
                  *(uint8_t **)
                   ((long)UVar3._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0xc0) =
                       original_handshake_hash.data;
                  iVar8 = CBS_get_optional_asn1(&session,&unused_hostname,(int *)0x0,0xa0000006);
                  if (iVar8 == 0) {
                    ERR_put_error(0x10,0,0xa0,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                  ,0x21b);
                  }
                  else {
                    this_00 = (__uniq_ptr_impl<char,_bssl::internal::Deleter> *)
                              ((long)ret._M_t.
                                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                              0x90);
                    iVar8 = CBS_get_optional_asn1_octet_string
                                      (&session,&original_handshake_hash,(int *)&age_add,0xa0000008)
                    ;
                    if (iVar8 == 0) {
                      iVar8 = 0x16f;
LAB_00220697:
                      ERR_put_error(0x10,0,0xa0,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                    ,iVar8);
                    }
                    else {
                      if ((int)age_add.data == 0) {
                        __p_00 = (uint8_t *)0x0;
                      }
                      else {
                        iVar9 = CBS_contains_zero_byte(&original_handshake_hash);
                        iVar8 = 0x174;
                        if (iVar9 != 0) goto LAB_00220697;
                        local_c8.data = (uint8_t *)0x0;
                        iVar8 = CBS_strdup(&original_handshake_hash,(char **)&local_c8);
                        __p_00 = local_c8.data;
                        if (iVar8 == 0) goto LAB_00220482;
                      }
                      std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                                (this_00,(pointer)__p_00);
                      iVar8 = SSL_SESSION_parse_u32
                                        (&session,(uint32_t *)
                                                  ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x17c),0xa0000009,0);
                      if ((iVar8 != 0) &&
                         (bVar4 = SSL_SESSION_parse_octet_string
                                            (&session,(Array<unsigned_char> *)
                                                      ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0xf8),0xa000000a), bVar4)) {
                        iVar8 = CBS_peek_asn1_tag(&session,0xa000000d);
                        if (iVar8 == 0) {
                          *(byte *)((long)ret._M_t.
                                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                          _M_head_impl + 0x1b8) =
                               *(byte *)((long)ret._M_t.
                                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                               _M_head_impl + 0x1b8) & 0xfd;
                        }
                        else {
                          iVar8 = CBS_get_asn1(&session,&child,0xa000000d);
                          if ((((iVar8 == 0) ||
                               (iVar8 = CBS_get_asn1(&child,&original_handshake_hash,4), iVar8 == 0)
                               ) || (original_handshake_hash.len != 0x20)) || (child.len != 0)) {
                            ERR_put_error(0x10,0,0xa0,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                          ,0x22d);
                            goto LAB_00220482;
                          }
                          uVar14 = *(undefined8 *)original_handshake_hash.data;
                          uVar1 = *(undefined8 *)(original_handshake_hash.data + 8);
                          uVar2 = *(undefined8 *)(original_handshake_hash.data + 0x18);
                          *(undefined8 *)
                           ((long)ret._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                           0x128) = *(undefined8 *)(original_handshake_hash.data + 0x10);
                          *(undefined8 *)
                           ((long)ret._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                           0x130) = uVar2;
                          *(undefined8 *)
                           ((long)ret._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                           0x118) = uVar14;
                          *(undefined8 *)
                           ((long)ret._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                           0x120) = uVar1;
                          *(byte *)((long)ret._M_t.
                                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                          _M_head_impl + 0x1b8) =
                               *(byte *)((long)ret._M_t.
                                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                               _M_head_impl + 0x1b8) | 2;
                        }
                        iVar8 = CBS_get_optional_asn1_octet_string
                                          (&session,&original_handshake_hash,(int *)0x0,0xa000000e);
                        if (((iVar8 != 0) &&
                            (in_01.size_ = original_handshake_hash.len,
                            in_01.data_ = original_handshake_hash.data,
                            bVar4 = InplaceVector<unsigned_char,_64UL>::TryCopyFrom
                                              ((InplaceVector<unsigned_char,_64UL> *)
                                               ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x138),in_01), bVar4)) &&
                           ((iVar8 = SSL_SESSION_parse_crypto_buffer
                                               (&session,(UniquePtr<CRYPTO_BUFFER> *)
                                                         ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x108),0xa000000f,pool), iVar8 != 0
                            && (iVar8 = SSL_SESSION_parse_crypto_buffer
                                                  (&session,(UniquePtr<CRYPTO_BUFFER> *)
                                                            ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x110),0xa0000010,pool), iVar8 != 0
                               )))) {
                          uVar14 = 0;
                          iVar8 = CBS_get_optional_asn1_bool
                                            (&session,&extended_master_secret,0xa0000011,0);
                          if (iVar8 == 0) {
                            ERR_put_error(0x10,0,0xa0,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                          ,0x248);
                          }
                          else {
                            uVar15 = CONCAT71((int7)((ulong)uVar14 >> 8),
                                              *(undefined1 *)
                                               ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x1b8)) & 0xfffffffffffffffe;
                            bVar12 = (byte)uVar15 | extended_master_secret != 0;
                            *(byte *)((long)ret._M_t.
                                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                            _M_head_impl + 0x1b8) = bVar12;
                            iVar8 = SSL_SESSION_parse_u16
                                              (&session,(uint16_t *)
                                                        ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 6),0xa0000012,
                                               (uint16_t)CONCAT71((int7)(uVar15 >> 8),bVar12));
                            if (iVar8 == 0) {
                              ERR_put_error(0x10,0,0xa0,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                            ,0x24e);
                            }
                            else {
                              local_c8.data = (uint8_t *)0x0;
                              local_c8.len = 0;
                              iVar8 = CBS_get_optional_asn1
                                                (&session,&local_c8,&has_cert_chain,0xa0000013);
                              UVar3 = ret;
                              if (iVar8 == 0) {
LAB_00220941:
                                ERR_put_error(0x10,0,0xa0,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                              ,600);
                              }
                              else {
                                if (has_cert_chain != 0) {
                                  if (local_c8.len == 0) goto LAB_00220941;
                                  if (has_peer == 0) {
                                    ERR_put_error(0x10,0,0xa0,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x25c);
                                    goto LAB_00220482;
                                  }
                                }
                                if (has_peer == 0 && has_cert_chain == 0) {
LAB_00220afd:
                                  iVar8 = CBS_get_optional_asn1_octet_string
                                                    (&session,&age_add,&age_add_present,0xa0000015);
                                  if (iVar8 != 0) {
                                    if (age_add_present == 0) {
                                      if (age_add.len == 0) {
                                        bVar12 = 0;
                                        goto LAB_00220b68;
                                      }
                                    }
                                    else {
                                      iVar8 = CBS_get_u32(&age_add,(uint32_t *)
                                                                   ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x180));
                                      if ((iVar8 != 0) && (age_add.len == 0)) {
                                        bVar12 = (age_add_present != 0) << 3;
LAB_00220b68:
                                        *(byte *)((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x1b8) =
                                             *(byte *)((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x1b8) & 0xf7 | bVar12;
                                        uVar14 = 0;
                                        iVar8 = CBS_get_optional_asn1_bool
                                                          (&session,&is_server,0xa0000016,1);
                                        if (iVar8 == 0) {
                                          ERR_put_error(0x10,0,0xa0,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x28b);
                                        }
                                        else {
                                          uVar15 = CONCAT71((int7)((ulong)uVar14 >> 8),
                                                            *(undefined1 *)
                                                             ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x1b8)) & 0xffffffffffffffef;
                                          bVar12 = (byte)uVar15 | (is_server != 0) << 4;
                                          *(byte *)((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x1b8) = bVar12;
                                          iVar8 = SSL_SESSION_parse_u16
                                                            (&session,(uint16_t *)
                                                                      ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 8),0xa0000017,
                                                  (uint16_t)CONCAT71((int7)(uVar15 >> 8),bVar12));
                                          if ((((iVar8 == 0) ||
                                               (iVar8 = SSL_SESSION_parse_u32
                                                                  (&session,(uint32_t *)
                                                                            ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x184),0xa0000018,0), iVar8 == 0))
                                              || (iVar8 = SSL_SESSION_parse_u32
                                                                    (&session,(uint32_t *)
                                                                              ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0xcc),0xa0000019,
                                                  *(uint32_t *)
                                                   ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 200)), iVar8 == 0)) ||
                                             (((bVar4 = SSL_SESSION_parse_octet_string
                                                                  (&session,(Array<unsigned_char> *)
                                                                            ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x188),0xa000001a), !bVar4 ||
                                               (iVar8 = CBS_get_optional_asn1_bool
                                                                  (&session,&is_quic,0xa000001b,0),
                                               iVar8 == 0)) ||
                                              (bVar4 = SSL_SESSION_parse_octet_string
                                                                 (&session,(Array<unsigned_char> *)
                                                                           ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x1c0),0xa000001c), !bVar4)))) {
                                            ERR_put_error(0x10,0,0xa0,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2a0);
                                          }
                                          else {
                                            iVar8 = CBS_get_optional_asn1_octet_string
                                                              (&session,&settings,&has_local_alps,
                                                               0xa000001d);
                                            if (((iVar8 == 0) ||
                                                (in.size_ = settings.len, in.data_ = settings.data,
                                                bVar4 = Array<unsigned_char>::CopyFrom
                                                                  ((Array<unsigned_char> *)
                                                                   ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x198),in), !bVar4)) ||
                                               ((iVar8 = CBS_get_optional_asn1_octet_string
                                                                   (&session,&settings,
                                                                    &has_peer_alps,0xa000001e),
                                                iVar8 == 0 ||
                                                (((in_00.size_ = settings.len,
                                                  in_00.data_ = settings.data,
                                                  bVar4 = Array<unsigned_char>::CopyFrom
                                                                    ((Array<unsigned_char> *)
                                                                     ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x1a8),in_00), !bVar4 ||
                                                  (iVar8 = CBS_get_optional_asn1_bool
                                                                     (&session,&
                                                  is_resumable_across_names,0xa000001f,0),
                                                  iVar8 == 0)) || (session.len != 0)))))) {
                                              ERR_put_error(0x10,0,0xa0,
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2b0);
                                            }
                                            else {
                                              bVar12 = *(byte *)((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x1b8);
                                              bVar6 = (is_quic != 0) << 5;
                                              bVar7 = (is_resumable_across_names != 0) << 7;
                                              *(byte *)((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x1b8) =
                                                   bVar7 | bVar12 & 0x5f | bVar6;
                                              if (has_local_alps == has_peer_alps) {
                                                if (has_local_alps == 0) {
                                                  bVar13 = 0;
                                                }
                                                else {
                                                  bVar13 = 0x40;
                                                  if (*(long *)((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 400) == 0) goto LAB_00220d83;
                                                }
                                                *(byte *)((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x1b8) =
                                                     bVar7 | bVar12 & 0x1f | bVar6 | bVar13;
                                                bVar4 = (*x509_method->session_cache_objects)
                                                                  ((SSL_SESSION *)
                                                                   ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl);
                                                if (bVar4) {
                                                  *(
                                                  __uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>
                                                  *)this = ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl;
                                                  ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl = (
                                                  __uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  )0x0;
                                                  goto LAB_00220486;
                                                }
                                                ERR_put_error(0x10,0,0xa0,
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2bf);
                                              }
                                              else {
LAB_00220d83:
                                                ERR_put_error(0x10,0,0xa0,
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2b9);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                else {
                                  __p = OPENSSL_sk_new_null();
                                  std::
                                  __uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::
                                  reset((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                         *)((long)UVar3._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x98),(pointer)__p);
                                  if (*(long *)((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x98) != 0) {
                                    if (has_peer == 0) goto LAB_00220a65;
                                    tVar11.
                                    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
                                         (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                          )CRYPTO_BUFFER_new_from_CBS(&peer,pool);
                                    age_add.data = (uint8_t *)
                                                   tVar11.
                                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                                  _M_head_impl;
                                    if (tVar11.
                                        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                        _M_head_impl ==
                                        (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
LAB_002209ff:
                                      *(undefined8 *)this = 0;
                                      pCVar16 = &age_add;
                                    }
                                    else {
                                      age_add.data = (uint8_t *)0x0;
                                      local_b0._M_t.
                                      super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl
                                           = (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>
                                              )(__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>
                                                )tVar11.
                                                 super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                                 _M_head_impl;
                                      eVar5 = PushToStack<stack_st_CRYPTO_BUFFER>
                                                        (*(stack_st_CRYPTO_BUFFER **)
                                                          ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x98),&local_b0);
                                      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                      ~unique_ptr(&local_b0);
                                      if (!eVar5) goto LAB_002209ff;
                                      pCVar16 = &age_add;
                                      while( true ) {
                                        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                        ~unique_ptr((
                                                  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                                  *)pCVar16);
LAB_00220a65:
                                        if (local_c8.len == 0) goto LAB_00220afd;
                                        iVar8 = CBS_get_any_asn1_element
                                                          (&local_c8,&age_add,(CBS_ASN1_TAG *)0x0,
                                                           (size_t *)0x0);
                                        if ((iVar8 == 0) || (age_add.len == 0)) {
                                          ERR_put_error(0x10,0,0xa0,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x271);
                                          goto LAB_00220482;
                                        }
                                        tVar11.
                                        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                        _M_head_impl = (
                                                  _Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                                  )CRYPTO_BUFFER_new_from_CBS(&age_add,pool);
                                        settings.data =
                                             (uint8_t *)
                                             tVar11.
                                             super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                             _M_head_impl;
                                        if (tVar11.
                                            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                            _M_head_impl ==
                                            (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) break;
                                        settings.data = (uint8_t *)0x0;
                                        local_b8._M_t.
                                        super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                        _M_head_impl = (
                                                  __uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>
                                                  )tVar11.
                                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                                  _M_head_impl;
                                        eVar5 = PushToStack<stack_st_CRYPTO_BUFFER>
                                                          (*(stack_st_CRYPTO_BUFFER **)
                                                            ((long)ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl + 0x98),&local_b8);
                                        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                        ~unique_ptr(&local_b8);
                                        if (!eVar5) break;
                                        pCVar16 = &settings;
                                      }
                                      *(undefined8 *)this = 0;
                                      pCVar16 = &settings;
                                    }
                                    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                    ~unique_ptr((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                                 *)pCVar16);
                                    goto LAB_00220486;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00220482:
  *(undefined8 *)this = 0;
LAB_00220486:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&ret);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<SSL_SESSION> SSL_SESSION_parse(CBS *cbs,
                                         const SSL_X509_METHOD *x509_method,
                                         CRYPTO_BUFFER_POOL *pool) {
  UniquePtr<SSL_SESSION> ret = ssl_session_new(x509_method);
  if (!ret) {
    return nullptr;
  }

  CBS session;
  uint64_t version, ssl_version;
  uint16_t unused;
  if (!CBS_get_asn1(cbs, &session, CBS_ASN1_SEQUENCE) ||  //
      !CBS_get_asn1_uint64(&session, &version) ||         //
      version != kVersion ||                              //
      !CBS_get_asn1_uint64(&session, &ssl_version) ||     //
      // Require sessions have versions valid in either TLS or DTLS. The session
      // will not be used by the handshake if not applicable, but, for
      // simplicity, never parse a session that does not pass
      // |ssl_protocol_version_from_wire|.
      ssl_version > UINT16_MAX ||  //
      !ssl_protocol_version_from_wire(&unused, ssl_version)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->ssl_version = ssl_version;

  CBS cipher;
  uint16_t cipher_value;
  if (!CBS_get_asn1(&session, &cipher, CBS_ASN1_OCTETSTRING) ||  //
      !CBS_get_u16(&cipher, &cipher_value) ||                    //
      CBS_len(&cipher) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->cipher = SSL_get_cipher_by_value(cipher_value);
  if (ret->cipher == NULL) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_CIPHER);
    return nullptr;
  }

  CBS session_id, secret, child;
  uint64_t timeout;
  if (!CBS_get_asn1(&session, &session_id, CBS_ASN1_OCTETSTRING) ||
      !ret->session_id.TryCopyFrom(session_id) ||
      !CBS_get_asn1(&session, &secret, CBS_ASN1_OCTETSTRING) ||
      !ret->secret.TryCopyFrom(secret) ||
      !CBS_get_asn1(&session, &child, kTimeTag) ||
      !CBS_get_asn1_uint64(&child, &ret->time) ||
      !CBS_get_asn1(&session, &child, kTimeoutTag) ||
      !CBS_get_asn1_uint64(&child, &timeout) ||  //
      timeout > UINT32_MAX) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  ret->timeout = (uint32_t)timeout;

  CBS peer;
  int has_peer;
  if (!CBS_get_optional_asn1(&session, &peer, &has_peer, kPeerTag) ||
      (has_peer && CBS_len(&peer) == 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  // |peer| is processed with the certificate chain.

  CBS sid_ctx;
  if (!CBS_get_optional_asn1_octet_string(
          &session, &sid_ctx, /*out_present=*/nullptr, kSessionIDContextTag) ||
      !ret->sid_ctx.TryCopyFrom(sid_ctx) ||
      !SSL_SESSION_parse_long(&session, &ret->verify_result, kVerifyResultTag,
                              X509_V_OK)) {
    return nullptr;
  }

  // Skip the historical hostName field.
  CBS unused_hostname;
  if (!CBS_get_optional_asn1(&session, &unused_hostname, nullptr,
                             kHostNameTag)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  if (!SSL_SESSION_parse_string(&session, &ret->psk_identity,
                                kPSKIdentityTag) ||
      !SSL_SESSION_parse_u32(&session, &ret->ticket_lifetime_hint,
                             kTicketLifetimeHintTag, 0) ||
      !SSL_SESSION_parse_octet_string(&session, &ret->ticket, kTicketTag)) {
    return nullptr;
  }

  if (CBS_peek_asn1_tag(&session, kPeerSHA256Tag)) {
    CBS peer_sha256;
    if (!CBS_get_asn1(&session, &child, kPeerSHA256Tag) ||
        !CBS_get_asn1(&child, &peer_sha256, CBS_ASN1_OCTETSTRING) ||
        CBS_len(&peer_sha256) != sizeof(ret->peer_sha256) ||
        CBS_len(&child) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
      return nullptr;
    }
    OPENSSL_memcpy(ret->peer_sha256, CBS_data(&peer_sha256),
                   sizeof(ret->peer_sha256));
    ret->peer_sha256_valid = true;
  } else {
    ret->peer_sha256_valid = false;
  }

  CBS original_handshake_hash;
  if (!CBS_get_optional_asn1_octet_string(&session, &original_handshake_hash,
                                          /*out_present=*/nullptr,
                                          kOriginalHandshakeHashTag) ||
      !ret->original_handshake_hash.TryCopyFrom(original_handshake_hash) ||
      !SSL_SESSION_parse_crypto_buffer(&session,
                                       &ret->signed_cert_timestamp_list,
                                       kSignedCertTimestampListTag, pool) ||
      !SSL_SESSION_parse_crypto_buffer(&session, &ret->ocsp_response,
                                       kOCSPResponseTag, pool)) {
    return nullptr;
  }

  int extended_master_secret;
  if (!CBS_get_optional_asn1_bool(&session, &extended_master_secret,
                                  kExtendedMasterSecretTag,
                                  0 /* default to false */)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->extended_master_secret = !!extended_master_secret;

  if (!SSL_SESSION_parse_u16(&session, &ret->group_id, kGroupIDTag, 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  CBS cert_chain;
  CBS_init(&cert_chain, NULL, 0);
  int has_cert_chain;
  if (!CBS_get_optional_asn1(&session, &cert_chain, &has_cert_chain,
                             kCertChainTag) ||
      (has_cert_chain && CBS_len(&cert_chain) == 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  if (has_cert_chain && !has_peer) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  if (has_peer || has_cert_chain) {
    ret->certs.reset(sk_CRYPTO_BUFFER_new_null());
    if (ret->certs == nullptr) {
      return nullptr;
    }

    if (has_peer) {
      UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new_from_CBS(&peer, pool));
      if (!buffer ||  //
          !PushToStack(ret->certs.get(), std::move(buffer))) {
        return nullptr;
      }
    }

    while (CBS_len(&cert_chain) > 0) {
      CBS cert;
      if (!CBS_get_any_asn1_element(&cert_chain, &cert, NULL, NULL) ||
          CBS_len(&cert) == 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
        return nullptr;
      }

      UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new_from_CBS(&cert, pool));
      if (buffer == nullptr ||
          !PushToStack(ret->certs.get(), std::move(buffer))) {
        return nullptr;
      }
    }
  }

  CBS age_add;
  int age_add_present;
  if (!CBS_get_optional_asn1_octet_string(&session, &age_add, &age_add_present,
                                          kTicketAgeAddTag) ||
      (age_add_present &&                                //
       !CBS_get_u32(&age_add, &ret->ticket_age_add)) ||  //
      CBS_len(&age_add) != 0) {
    return nullptr;
  }
  ret->ticket_age_add_valid = age_add_present != 0;

  int is_server;
  if (!CBS_get_optional_asn1_bool(&session, &is_server, kIsServerTag,
                                  1 /* default to true */)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  /* TODO: in time we can include |is_server| for servers too, then we can
     enforce that client and server sessions are never mixed up. */

  ret->is_server = is_server;

  int is_quic;
  if (!SSL_SESSION_parse_u16(&session, &ret->peer_signature_algorithm,
                             kPeerSignatureAlgorithmTag, 0) ||
      !SSL_SESSION_parse_u32(&session, &ret->ticket_max_early_data,
                             kTicketMaxEarlyDataTag, 0) ||
      !SSL_SESSION_parse_u32(&session, &ret->auth_timeout, kAuthTimeoutTag,
                             ret->timeout) ||
      !SSL_SESSION_parse_octet_string(&session, &ret->early_alpn,
                                      kEarlyALPNTag) ||
      !CBS_get_optional_asn1_bool(&session, &is_quic, kIsQuicTag,
                                  /*default_value=*/false) ||
      !SSL_SESSION_parse_octet_string(&session, &ret->quic_early_data_context,
                                      kQuicEarlyDataContextTag)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  CBS settings;
  int has_local_alps, has_peer_alps, is_resumable_across_names;
  if (!CBS_get_optional_asn1_octet_string(&session, &settings, &has_local_alps,
                                          kLocalALPSTag) ||
      !ret->local_application_settings.CopyFrom(settings) ||
      !CBS_get_optional_asn1_octet_string(&session, &settings, &has_peer_alps,
                                          kPeerALPSTag) ||
      !ret->peer_application_settings.CopyFrom(settings) ||
      !CBS_get_optional_asn1_bool(&session, &is_resumable_across_names,
                                  kResumableAcrossNamesTag,
                                  /*default_value=*/false) ||
      CBS_len(&session) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->is_quic = is_quic;
  ret->is_resumable_across_names = is_resumable_across_names;

  // The two ALPS values and ALPN must be consistent.
  if (has_local_alps != has_peer_alps ||
      (has_local_alps && ret->early_alpn.empty())) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->has_application_settings = has_local_alps;

  if (!x509_method->session_cache_objects(ret.get())) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  return ret;
}